

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Vector *this_00;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  idx_t iVar7;
  data_ptr_t pdVar8;
  idx_t iVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  idx_t i;
  ulong uVar13;
  ulong uVar14;
  string_t sVar15;
  UnifiedVectorFormat state_format;
  data_ptr_t local_c8;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a8;
  ulong local_a0;
  buffer_ptr<ValidityBuffer> *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  local_c8 = (data_ptr_t)ListVector::GetListSize(result);
  if (count == 0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    iVar7 = 0;
    do {
      iVar9 = iVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar7];
      }
      lVar12 = lVar12 + *(long *)(*(long *)(local_78.data + iVar9 * 8) + 0x10);
      iVar7 = iVar7 + 1;
    } while (count != iVar7);
  }
  ListVector::Reserve(result,(idx_t)(local_c8 + lVar12));
  local_90 = result->data;
  this_00 = ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar13 = 0;
    local_a8 = result;
    local_a0 = count;
    do {
      uVar10 = uVar13;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_78.sel)->sel_vector[uVar13];
      }
      uVar14 = uVar13 + local_88;
      lVar12 = *(long *)(local_78.data + uVar10 * 8);
      if ((*(char *)(lVar12 + 0x18) == '\x01') && (lVar1 = *(long *)(lVar12 + 0x10), lVar1 != 0)) {
        *(data_ptr_t *)(local_90 + uVar14 * 0x10) = local_c8;
        *(long *)(local_90 + uVar14 * 0x10 + 8) = lVar1;
        local_b8._M_comp = BinaryAggregateHeap<float,_duckdb::string_t,_duckdb::LessThan>::Compare;
        pdVar8 = local_c8;
        ::std::
        __sort_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                  (*(pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar12 + 8),
                   *(pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar12 + 8) + lVar1,&local_b8);
        if (*(long *)(lVar12 + 0x10) != 0) {
          puVar11 = (undefined8 *)(*(long *)(lVar12 + 8) + 0x10);
          uVar10 = (long)local_c8 << 4 | 8;
          uVar14 = 0;
          do {
            sVar15.value.pointer.ptr = (char *)pdVar8;
            sVar15.value._0_8_ = *puVar11;
            sVar15 = StringVector::AddStringOrBlob
                               ((StringVector *)this_00,(Vector *)puVar11[-1],sVar15);
            pdVar8 = this_00->data;
            *(long *)(pdVar8 + (uVar10 - 8)) = sVar15.value._0_8_;
            *(long *)(pdVar8 + uVar10) = sVar15.value._8_8_;
            uVar14 = uVar14 + 1;
            puVar11 = puVar11 + 5;
            uVar10 = uVar10 + 0x10;
          } while (uVar14 < *(ulong *)(lVar12 + 0x10));
          local_c8 = local_c8 + uVar14;
          count = local_a0;
          result = local_a8;
        }
      }
      else {
        _Var6._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var6._M_head_impl == (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var4 = p_Stack_b0;
          _Var3._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
                *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var3._M_comp;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_98);
          _Var6._M_head_impl =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var6._M_head_impl;
        }
        bVar2 = (byte)uVar14 & 0x3f;
        _Var6._M_head_impl[uVar14 >> 6] =
             _Var6._M_head_impl[uVar14 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != count);
  }
  ListVector::SetListSize(result,(idx_t)local_c8);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}